

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O1

XrResult LayerTestXrGetInstanceProcAddr(XrInstance instance,char *name,PFN_xrVoidFunction *function)

{
  int iVar1;
  XrResult XVar2;
  code *pcVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  iVar1 = strcmp(name,"xrGetInstanceProcAddr");
  if (iVar1 == 0) {
    pcVar3 = LayerTestXrGetInstanceProcAddr;
  }
  else {
    iVar1 = strcmp(name,"xrCreateInstance");
    if (iVar1 == 0) {
      pcVar3 = LayerTestXrCreateInstance;
    }
    else {
      iVar1 = strcmp(name,"xrDestroyInstance");
      pcVar3 = (PFN_xrVoidFunction)0x0;
      if (iVar1 == 0) {
        pcVar3 = LayerTestXrDestroyInstance;
      }
    }
  }
  *function = pcVar3;
  XVar2 = XR_SUCCESS;
  if (pcVar3 == (PFN_xrVoidFunction)0x0) {
    p_Var6 = &g_next_gipa_map._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = p_Var6;
    if (g_next_gipa_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var4 = &g_next_gipa_map._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var5 = g_next_gipa_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (*(XrInstance *)(p_Var5 + 1) >= instance) {
          p_Var4 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(XrInstance *)(p_Var5 + 1) < instance];
      } while (p_Var5 != (_Base_ptr)0x0);
    }
    if (((_Rb_tree_header *)p_Var4 != &g_next_gipa_map._M_t._M_impl.super__Rb_tree_header) &&
       (p_Var6 = &g_next_gipa_map._M_t._M_impl.super__Rb_tree_header._M_header,
       *(XrInstance *)(p_Var4 + 1) <= instance)) {
      p_Var6 = p_Var4;
    }
    if ((_Rb_tree_header *)p_Var6 != &g_next_gipa_map._M_t._M_impl.super__Rb_tree_header) {
      XVar2 = (*(code *)p_Var6[1]._M_parent)(instance,name,function);
      return XVar2;
    }
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
  return XVar2;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL LayerTestXrGetInstanceProcAddr(XrInstance instance, const char *name,
                                                                     PFN_xrVoidFunction *function) {
    if (0 == strcmp(name, "xrGetInstanceProcAddr")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrGetInstanceProcAddr);
    } else if (0 == strcmp(name, "xrCreateInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrCreateInstance);
    } else if (0 == strcmp(name, "xrDestroyInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrDestroyInstance);
    } else {
        *function = nullptr;
    }

    if (*function != nullptr) {
        return XR_SUCCESS;
    }

    // If the function is not intercepted in this layer, call down to the next layer.
    auto it = g_next_gipa_map.find(instance);
    if (it == std::end(g_next_gipa_map)) {
        return XR_ERROR_HANDLE_INVALID;
    }

    return it->second(instance, name, function);
}